

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O2

bool __thiscall Incppect<true>::Impl::hasExt(Impl *this,string_view file,string_view ext)

{
  bool bVar1;
  reverse_iterator<const_char_*> local_18;
  reverse_iterator<const_char_*> local_10;
  reverse_iterator<const_char_*> local_8;
  
  local_10.current = ext._M_str;
  if (file._M_len < ext._M_len) {
    return false;
  }
  local_8.current = local_10.current + ext._M_len;
  local_18.current = file._M_str + file._M_len;
  bVar1 = std::equal<std::reverse_iterator<char_const*>,std::reverse_iterator<char_const*>>
                    (&local_8,&local_10,&local_18);
  return bVar1;
}

Assistant:

inline bool hasExt(std::string_view file, std::string_view ext) {
        if (ext.size() > file.size()) {
            return false;
        }
        return std::equal(ext.rbegin(), ext.rend(), file.rbegin());
    }